

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::connected(TcpConnection *this)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  enable_shared_from_this<TcpConnection> local_20;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->tc_connected_cb);
  if (bVar1) {
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","connected",0x75);
    }
    lVar2 = Logger::get_log_level();
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"connected",0x75,LOG_LEVEL_INFO,
                        "execute connected callback, conn fd is %d\n",this->tc_fd);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    std::enable_shared_from_this<TcpConnection>::shared_from_this(&local_20);
    std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::operator()
              (&this->tc_connected_cb,(shared_ptr<TcpConnection> *)&local_20);
    std::shared_ptr<TcpConnection>::~shared_ptr((shared_ptr<TcpConnection> *)&local_20);
  }
  else {
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","connected",0x79);
    }
    lVar2 = Logger::get_log_level();
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                        ,"connected",0x79,LOG_LEVEL_INFO,"tcp connected callback is null\n");
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
  }
  return;
}

Assistant:

void TcpConnection::connected() {
    if(tc_connected_cb) {
        LOG_INFO("execute connected callback, conn fd is %d\n", tc_fd);
        tc_connected_cb(shared_from_this());
    }
    else {
        LOG_INFO("tcp connected callback is null\n");
    }
}